

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

void Mem_FlexRestart(Mem_Flex_t *p)

{
  int local_14;
  int i;
  Mem_Flex_t *p_local;
  
  if (p->nChunks != 0) {
    for (local_14 = 1; local_14 < p->nChunks; local_14 = local_14 + 1) {
      if (p->pChunks[local_14] != (char *)0x0) {
        free(p->pChunks[local_14]);
        p->pChunks[local_14] = (char *)0x0;
      }
    }
    p->nChunks = 1;
    p->nMemoryAlloc = p->nChunkSize;
    p->pCurrent = *p->pChunks;
    p->pEnd = p->pCurrent + p->nChunkSize;
    p->nEntriesUsed = 0;
    p->nMemoryUsed = 0;
  }
  return;
}

Assistant:

void Mem_FlexRestart( Mem_Flex_t * p )
{
    int i;
    if ( p->nChunks == 0 )
        return;
    // deallocate all chunks except the first one
    for ( i = 1; i < p->nChunks; i++ )
        ABC_FREE( p->pChunks[i] );
    p->nChunks  = 1;
    p->nMemoryAlloc = p->nChunkSize;
    // transform these entries into a linked list
    p->pCurrent = p->pChunks[0];
    p->pEnd     = p->pCurrent + p->nChunkSize;
    p->nEntriesUsed = 0;
    p->nMemoryUsed = 0;
}